

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-alloc-cb-fail.c
# Opt level: O2

int run_test_udp_alloc_cb_fail(void)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  int iVar7;
  uv_loop_t *puVar8;
  undefined8 uVar9;
  char *pcVar10;
  char *pcVar11;
  int64_t eval_b_6;
  int64_t eval_a_6;
  int64_t eval_b;
  ulong local_168;
  sockaddr_in addr;
  uv_udp_send_t req;
  
  local_168 = eval_b;
  iVar7 = uv_ip4_addr("0.0.0.0",0x23a3,&addr);
  req.data = (void *)(long)iVar7;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = local_168;
  _eval_b = (uv_buf_t)(auVar6 << 0x40);
  if (req.data == (void *)0x0) {
    puVar8 = uv_default_loop();
    iVar7 = uv_udp_init(puVar8,&server);
    req.data = (void *)(long)iVar7;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = local_168;
    _eval_b = (uv_buf_t)(auVar1 << 0x40);
    if (req.data == (void *)0x0) {
      iVar7 = uv_udp_bind(&server,(sockaddr *)&addr,0);
      req.data = (void *)(long)iVar7;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = local_168;
      _eval_b = (uv_buf_t)(auVar2 << 0x40);
      if (req.data == (void *)0x0) {
        iVar7 = uv_udp_recv_start(&server,sv_alloc_cb,sv_recv_cb);
        req.data = (void *)(long)iVar7;
        auVar3._8_8_ = 0;
        auVar3._0_8_ = local_168;
        _eval_b = (uv_buf_t)(auVar3 << 0x40);
        if (req.data == (void *)0x0) {
          iVar7 = uv_ip4_addr("127.0.0.1",0x23a3,&addr);
          req.data = (void *)(long)iVar7;
          auVar4._8_8_ = 0;
          auVar4._0_8_ = local_168;
          _eval_b = (uv_buf_t)(auVar4 << 0x40);
          if (req.data == (void *)0x0) {
            puVar8 = uv_default_loop();
            iVar7 = uv_udp_init(puVar8,&client);
            req.data = (void *)(long)iVar7;
            auVar5._8_8_ = 0;
            auVar5._0_8_ = local_168;
            _eval_b = (uv_buf_t)(auVar5 << 0x40);
            if (req.data == (void *)0x0) {
              _eval_b = uv_buf_init("PING",4);
              iVar7 = uv_udp_send(&req,&client,(uv_buf_t *)&eval_b,1,(sockaddr *)&addr,cl_send_cb);
              eval_a_6 = (int64_t)iVar7;
              eval_b_6 = 0;
              if ((void *)eval_a_6 == (void *)0x0) {
                eval_a_6 = (int64_t)close_cb_called;
                eval_b_6 = 0;
                if ((void *)eval_a_6 == (void *)0x0) {
                  eval_a_6 = (int64_t)cl_send_cb_called;
                  eval_b_6 = 0;
                  if ((void *)eval_a_6 == (void *)0x0) {
                    eval_a_6 = (int64_t)cl_recv_cb_called;
                    eval_b_6 = 0;
                    if ((void *)eval_a_6 == (void *)0x0) {
                      eval_a_6 = (int64_t)sv_send_cb_called;
                      eval_b_6 = 0;
                      if ((void *)eval_a_6 == (void *)0x0) {
                        eval_a_6 = (int64_t)sv_recv_cb_called;
                        eval_b_6 = 0;
                        if ((void *)eval_a_6 == (void *)0x0) {
                          puVar8 = uv_default_loop();
                          uv_run(puVar8,UV_RUN_DEFAULT);
                          eval_a_6 = 1;
                          eval_b_6 = (int64_t)cl_send_cb_called;
                          if (eval_b_6 == 1) {
                            eval_a_6 = 1;
                            eval_b_6 = (int64_t)cl_recv_cb_called;
                            if (eval_b_6 == 1) {
                              eval_a_6 = 1;
                              eval_b_6 = (int64_t)sv_send_cb_called;
                              if (eval_b_6 == 1) {
                                eval_a_6 = 1;
                                eval_b_6 = (int64_t)sv_recv_cb_called;
                                if (eval_b_6 == 1) {
                                  eval_a_6 = 2;
                                  eval_b_6 = (int64_t)close_cb_called;
                                  if (eval_b_6 == 2) {
                                    puVar8 = uv_default_loop();
                                    uv_walk(puVar8,close_walk_cb,(void *)0x0);
                                    uv_run(puVar8,UV_RUN_DEFAULT);
                                    eval_a_6 = 0;
                                    puVar8 = uv_default_loop();
                                    iVar7 = uv_loop_close(puVar8);
                                    eval_b_6 = (int64_t)iVar7;
                                    if (eval_b_6 == 0) {
                                      uv_library_shutdown();
                                      return 0;
                                    }
                                    pcVar11 = "uv_loop_close(uv_default_loop())";
                                    pcVar10 = "0";
                                    uVar9 = 0xc2;
                                  }
                                  else {
                                    pcVar11 = "close_cb_called";
                                    pcVar10 = "2";
                                    uVar9 = 0xc0;
                                  }
                                }
                                else {
                                  pcVar11 = "sv_recv_cb_called";
                                  pcVar10 = "1";
                                  uVar9 = 0xbf;
                                }
                              }
                              else {
                                pcVar11 = "sv_send_cb_called";
                                pcVar10 = "1";
                                uVar9 = 0xbe;
                              }
                            }
                            else {
                              pcVar11 = "cl_recv_cb_called";
                              pcVar10 = "1";
                              uVar9 = 0xbd;
                            }
                          }
                          else {
                            pcVar11 = "cl_send_cb_called";
                            pcVar10 = "1";
                            uVar9 = 0xbc;
                          }
                        }
                        else {
                          pcVar11 = "0";
                          pcVar10 = "sv_recv_cb_called";
                          uVar9 = 0xb8;
                        }
                      }
                      else {
                        pcVar11 = "0";
                        pcVar10 = "sv_send_cb_called";
                        uVar9 = 0xb7;
                      }
                    }
                    else {
                      pcVar11 = "0";
                      pcVar10 = "cl_recv_cb_called";
                      uVar9 = 0xb6;
                    }
                  }
                  else {
                    pcVar11 = "0";
                    pcVar10 = "cl_send_cb_called";
                    uVar9 = 0xb5;
                  }
                }
                else {
                  pcVar11 = "0";
                  pcVar10 = "close_cb_called";
                  uVar9 = 0xb4;
                }
              }
              else {
                pcVar11 = "0";
                pcVar10 = "r";
                uVar9 = 0xb2;
              }
              goto LAB_0019cde9;
            }
            pcVar10 = "r";
            uVar9 = 0xa9;
          }
          else {
            pcVar10 = "uv_ip4_addr(\"127.0.0.1\", 9123, &addr)";
            uVar9 = 0xa6;
          }
        }
        else {
          pcVar10 = "r";
          uVar9 = 0xa4;
        }
      }
      else {
        pcVar10 = "r";
        uVar9 = 0xa1;
      }
    }
    else {
      pcVar10 = "r";
      uVar9 = 0x9e;
    }
  }
  else {
    pcVar10 = "uv_ip4_addr(\"0.0.0.0\", 9123, &addr)";
    uVar9 = 0x9b;
  }
  pcVar11 = "0";
  eval_b_6 = 0;
  eval_a_6 = (int64_t)req.data;
LAB_0019cde9:
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-alloc-cb-fail.c"
          ,uVar9,pcVar10,"==",pcVar11,eval_a_6,"==",eval_b_6);
  abort();
}

Assistant:

TEST_IMPL(udp_alloc_cb_fail) {
  struct sockaddr_in addr;
  uv_udp_send_t req;
  uv_buf_t buf;
  int r;

  ASSERT_OK(uv_ip4_addr("0.0.0.0", TEST_PORT, &addr));

  r = uv_udp_init(uv_default_loop(), &server);
  ASSERT_OK(r);

  r = uv_udp_bind(&server, (const struct sockaddr*) &addr, 0);
  ASSERT_OK(r);

  r = uv_udp_recv_start(&server, sv_alloc_cb, sv_recv_cb);
  ASSERT_OK(r);

  ASSERT_OK(uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));

  r = uv_udp_init(uv_default_loop(), &client);
  ASSERT_OK(r);

  buf = uv_buf_init("PING", 4);
  r = uv_udp_send(&req,
                  &client,
                  &buf,
                  1,
                  (const struct sockaddr*) &addr,
                  cl_send_cb);
  ASSERT_OK(r);

  ASSERT_OK(close_cb_called);
  ASSERT_OK(cl_send_cb_called);
  ASSERT_OK(cl_recv_cb_called);
  ASSERT_OK(sv_send_cb_called);
  ASSERT_OK(sv_recv_cb_called);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT_EQ(1, cl_send_cb_called);
  ASSERT_EQ(1, cl_recv_cb_called);
  ASSERT_EQ(1, sv_send_cb_called);
  ASSERT_EQ(1, sv_recv_cb_called);
  ASSERT_EQ(2, close_cb_called);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}